

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int stbi_tga_test_file(FILE *f)

{
  int iVar1;
  int iVar2;
  long lVar3;
  FILE *in_RDI;
  int n;
  int r;
  stbi s;
  undefined4 in_stack_ffffffffffffffcc;
  stbi local_30;
  FILE *local_8;
  
  local_8 = in_RDI;
  lVar3 = ftell(in_RDI);
  iVar1 = (int)lVar3;
  start_file(&local_30,(FILE *)local_8);
  iVar2 = tga_test((stbi *)CONCAT44(in_stack_ffffffffffffffcc,iVar1));
  fseek(local_8,(long)iVar1,0);
  return iVar2;
}

Assistant:

int      stbi_tga_test_file        (FILE *f)
{
   stbi s;
   int r,n = ftell(f);
   start_file(&s, f);
   r = tga_test(&s);
   fseek(f,n,SEEK_SET);
   return r;
}